

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_test.cc
# Opt level: O2

double __thiscall leveldb::BloomTest::FalsePositiveRate(BloomTest *this)

{
  int iVar1;
  int i;
  int iVar2;
  int iVar3;
  bool bVar4;
  char buffer [4];
  int local_44;
  Slice local_40;
  
  iVar1 = 0;
  iVar3 = 10000;
  iVar2 = 0;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    local_44 = iVar2 + 1000000000;
    local_40.size_ = 4;
    local_40.data_ = (char *)&local_44;
    bVar4 = Matches(this,&local_40);
    iVar1 = iVar1 + (uint)bVar4;
    iVar2 = iVar2 + 1;
  }
  return (double)iVar1 / 10000.0;
}

Assistant:

double FalsePositiveRate() {
    char buffer[sizeof(int)];
    int result = 0;
    for (int i = 0; i < 10000; i++) {
      if (Matches(Key(i + 1000000000, buffer))) {
        result++;
      }
    }
    return result / 10000.0;
  }